

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void __thiscall
BaseIndex::BlockConnected
          (BaseIndex *this,ChainstateRole role,shared_ptr<const_CBlock> *block,CBlockIndex *pindex)

{
  CBlockIndex *this_00;
  CBlockIndex *new_tip;
  uint256 *puVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  CBlockIndex *pCVar4;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  BlockInfo block_info;
  undefined1 local_160 [16];
  uint256 local_150;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  string local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8 [3];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((role != ASSUMEDVALID) && (((this->m_synced)._M_base._M_i & 1U) != 0)) {
    this_00 = (this->m_best_block_index)._M_b._M_p;
    if (this_00 == (CBlockIndex *)0x0) {
      if (pindex->nHeight != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          FatalErrorf<char[15],int>
                    (this,"%s: First block connected is not the genesis block (height=%d)",
                     (char (*) [15])"BlockConnected",&pindex->nHeight);
          return;
        }
        goto LAB_00893719;
      }
LAB_008931f9:
      kernel::MakeBlockInfo
                ((BlockInfo *)local_160,pindex,
                 (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xc])
                        (this,(BlockInfo *)local_160);
      if ((char)iVar3 == '\0') {
        puVar1 = pindex->phashBlock;
        if (puVar1 == (uint256 *)0x0) {
LAB_008933f3:
          __assert_fail("phashBlock != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                        ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
        }
        local_68 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
        uStack_60 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
        local_58 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
        uStack_50 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
        base_blob<256u>::ToString_abi_cxx11_(&local_48,&local_68);
        FatalErrorf<char[15],std::__cxx11::string>
                  (this,"%s: Failed to write block %s to index",(char (*) [15])"BlockConnected",
                   &local_48);
        local_c8[0]._M_dataplus._M_p = local_48._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) goto LAB_0089328d;
      }
      else {
        SetBestBlockIndex(this,pindex);
      }
    }
    else {
      pCVar4 = CBlockIndex::GetAncestor(this_00,pindex->nHeight + -1);
      new_tip = pindex->pprev;
      if (pCVar4 == new_tip) {
        if ((new_tip != this_00) && (bVar2 = Rewind(this,this_00,new_tip), !bVar2)) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            FatalErrorf<char[15],std::__cxx11::string>
                      (this,"%s: Failed to rewind index %s to a previous chain tip",
                       (char (*) [15])"BlockConnected",&this->m_name);
            return;
          }
          goto LAB_00893719;
        }
        goto LAB_008931f9;
      }
      puVar1 = pindex->phashBlock;
      if (puVar1 == (uint256 *)0x0) goto LAB_008933f3;
      local_e8 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      uStack_e0 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_d8 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_d0 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::ToString_abi_cxx11_(local_c8,&local_e8);
      puVar1 = this_00->phashBlock;
      if (puVar1 == (uint256 *)0x0) goto LAB_008933f3;
      local_128 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      uStack_120 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_118 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_110 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::ToString_abi_cxx11_(&local_108,&local_128);
      pLVar5 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar5);
      if (bVar2) {
        local_160._8_8_ = (uint256 *)0x0;
        local_150.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        local_160._0_8_ = (uint256 *)(local_160 + 0x10);
        tinyformat::format<char[15],std::__cxx11::string,std::__cxx11::string>
                  (&local_48,
                   (tinyformat *)
                   "%s: WARNING: Block %s does not connect to an ancestor of known best chain (tip=%s); not updating index\n"
                   ,"BlockConnected",(char (*) [15])local_c8,&local_108,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        pLVar5 = LogInstance();
        local_48._M_dataplus._M_p = (pointer)0x57;
        local_48._M_string_length = 0xfbda67;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = (char *)local_160._0_8_;
        str._M_len = local_160._8_8_;
        logging_function._M_str = "BlockConnected";
        logging_function._M_len = 0xe;
        BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x130,ALL,Info);
        if ((uint256 *)local_160._0_8_ != (uint256 *)(local_160 + 0x10)) {
          operator_delete((void *)local_160._0_8_,
                          CONCAT71(local_150.super_base_blob<256U>.m_data._M_elems._1_7_,
                                   local_150.super_base_blob<256U>.m_data._M_elems[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      local_48.field_2._M_allocated_capacity = local_c8[0].field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p == &local_c8[0].field_2) goto LAB_00893295;
LAB_0089328d:
      operator_delete(local_c8[0]._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00893295:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00893719:
  __stack_chk_fail();
}

Assistant:

void BaseIndex::BlockConnected(ChainstateRole role, const std::shared_ptr<const CBlock>& block, const CBlockIndex* pindex)
{
    // Ignore events from the assumed-valid chain; we will process its blocks
    // (sequentially) after it is fully verified by the background chainstate. This
    // is to avoid any out-of-order indexing.
    //
    // TODO at some point we could parameterize whether a particular index can be
    // built out of order, but for now just do the conservative simple thing.
    if (role == ChainstateRole::ASSUMEDVALID) {
        return;
    }

    // Ignore BlockConnected signals until we have fully indexed the chain.
    if (!m_synced) {
        return;
    }

    const CBlockIndex* best_block_index = m_best_block_index.load();
    if (!best_block_index) {
        if (pindex->nHeight != 0) {
            FatalErrorf("%s: First block connected is not the genesis block (height=%d)",
                       __func__, pindex->nHeight);
            return;
        }
    } else {
        // Ensure block connects to an ancestor of the current best block. This should be the case
        // most of the time, but may not be immediately after the sync thread catches up and sets
        // m_synced. Consider the case where there is a reorg and the blocks on the stale branch are
        // in the ValidationInterface queue backlog even after the sync thread has caught up to the
        // new chain tip. In this unlikely event, log a warning and let the queue clear.
        if (best_block_index->GetAncestor(pindex->nHeight - 1) != pindex->pprev) {
            LogPrintf("%s: WARNING: Block %s does not connect to an ancestor of "
                      "known best chain (tip=%s); not updating index\n",
                      __func__, pindex->GetBlockHash().ToString(),
                      best_block_index->GetBlockHash().ToString());
            return;
        }
        if (best_block_index != pindex->pprev && !Rewind(best_block_index, pindex->pprev)) {
            FatalErrorf("%s: Failed to rewind index %s to a previous chain tip",
                       __func__, GetName());
            return;
        }
    }
    interfaces::BlockInfo block_info = kernel::MakeBlockInfo(pindex, block.get());
    if (CustomAppend(block_info)) {
        // Setting the best block index is intentionally the last step of this
        // function, so BlockUntilSyncedToCurrentChain callers waiting for the
        // best block index to be updated can rely on the block being fully
        // processed, and the index object being safe to delete.
        SetBestBlockIndex(pindex);
    } else {
        FatalErrorf("%s: Failed to write block %s to index",
                   __func__, pindex->GetBlockHash().ToString());
        return;
    }
}